

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_heap.cpp
# Opt level: O0

ON__UINT_PTR * __thiscall
ON_SubD_FixedSizeHeap::AllocatePtrArray(ON_SubD_FixedSizeHeap *this,uint capacity,bool bZeroMemory)

{
  ON_SubD_FixedSizeHeap *local_30;
  ON__UINT_PTR *p1;
  ON__UINT_PTR *p;
  bool bZeroMemory_local;
  uint capacity_local;
  ON_SubD_FixedSizeHeap *this_local;
  
  if (capacity == 0) {
    this_local = (ON_SubD_FixedSizeHeap *)0x0;
  }
  else if ((this->m_p == (ON__UINT_PTR *)0x0) || (this->m_p_capacity < capacity + this->m_p_index))
  {
    ON_SubDIncrementErrorCount();
    this_local = (ON_SubD_FixedSizeHeap *)0x0;
  }
  else {
    this_local = (ON_SubD_FixedSizeHeap *)(this->m_p + this->m_p_index);
    this->m_p_index = capacity + this->m_p_index;
    if (bZeroMemory) {
      for (local_30 = (ON_SubD_FixedSizeHeap *)(&this_local->m_sn + (ulong)capacity * 2);
          this_local < local_30; local_30 = (ON_SubD_FixedSizeHeap *)&local_30[-1].m_h_capacity) {
        local_30[-1].m_h_capacity = 0;
        local_30[-1].m_h_count = 0;
      }
    }
  }
  return (ON__UINT_PTR *)this_local;
}

Assistant:

ON__UINT_PTR* ON_SubD_FixedSizeHeap::AllocatePtrArray(
  unsigned int capacity,
  bool bZeroMemory
  )
{
  if (0 == capacity)
    return nullptr;

  if (nullptr == m_p || capacity + m_p_index > m_p_capacity)
    return ON_SUBD_RETURN_ERROR(nullptr);

  ON__UINT_PTR* p = m_p + m_p_index;
  m_p_index += capacity;

  if (bZeroMemory)
  {
    ON__UINT_PTR* p1 = p + capacity;
    while (p1 > p)
    {
      *(--p1) = 0;
    }
  }

  return p;
}